

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

NodePtr __thiscall avro::NodeSymbolic::getNode(NodeSymbolic *this)

{
  bool bVar1;
  undefined8 uVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  shared_count extraout_RDX;
  long *in_RSI;
  element_type *in_RDI;
  NodePtr NVar3;
  NodePtr *node;
  Name *in_stack_fffffffffffffec8;
  weak_ptr<avro::Node> *in_stack_fffffffffffffed8;
  format *in_stack_ffffffffffffff08;
  Exception *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff38;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  
  boost::weak_ptr<avro::Node>::lock(in_stack_fffffffffffffed8);
  bVar1 = boost::shared_ptr<avro::Node>::operator!((shared_ptr<avro::Node> *)in_RDI);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (**(code **)(*in_RSI + 0x18))();
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this_00,in_stack_fffffffffffffec8);
    Exception::Exception(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  NVar3.pn.pi_ = extraout_RDX.pi_;
  NVar3.px = in_RDI;
  return NVar3;
}

Assistant:

NodePtr getNode() const {
        NodePtr node = actualNode_.lock();
        if(!node) {
            throw Exception(boost::format("Could not follow symbol %1%") % name());
        }
        return node;
    }